

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-condvar.c
# Opt level: O2

int condvar_wait(worker_config_conflict *c,int *flag)

{
  uv_mutex_t *puVar1;
  long lVar2;
  int64_t eval_b;
  int64_t eval_a;
  
  puVar1 = &c->mutex;
  uv_mutex_lock(puVar1);
  uv_sem_post(c);
  do {
    uv_cond_wait(&c->cond,puVar1);
    lVar2 = (long)*flag;
  } while (lVar2 == 0);
  if (lVar2 == 1) {
    uv_mutex_unlock(puVar1);
    uv_sem_wait(&c->sem_signaled);
    return 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-condvar.c"
          ,0x74,"1","==","*flag",1,"==",lVar2);
  abort();
}

Assistant:

static int condvar_wait(worker_config* c, const int* flag) {
  uv_mutex_lock(&c->mutex);

  /* Tell signal'er that I am waiting. */
  uv_sem_post(&c->sem_waiting);

  /* Wait until I get a non-spurious signal. */
  do {
    uv_cond_wait(&c->cond, &c->mutex);
  } while (*flag == 0);
  ASSERT_EQ(1, *flag);

  uv_mutex_unlock(&c->mutex);

  /* Wait for my signal'er to finish. */
  uv_sem_wait(&c->sem_signaled);

  return 0;
}